

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationTest.cpp
# Opt level: O2

void initGlobals(int argc,char **argv)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (argc < 2) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    std::operator+(&local_78,"./bread",&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&local_78,argv[1],(allocator *)&local_38);
  }
  std::__cxx11::string::operator=((string *)&g_bread_path_abi_cxx11_,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (argc < 2) {
    std::__cxx11::string::~string((string *)&local_38);
LAB_0010b2dc:
    std::__cxx11::string::string((string *)&local_78,"./",(allocator *)&local_58);
    std::__cxx11::string::operator=((string *)&g_inttest_dir_abi_cxx11_,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    if (argc == 2) goto LAB_0010b2dc;
    pcVar1 = argv[2];
    std::__cxx11::string::string((string *)&local_58,"/",&local_79);
    std::operator+(&local_78,pcVar1,&local_58);
    std::__cxx11::string::operator=((string *)&g_inttest_dir_abi_cxx11_,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    if (3 < (uint)argc) {
      pcVar1 = argv[3];
      std::__cxx11::string::string((string *)&local_58,"/test/integration/",&local_79);
      std::operator+(&local_78,pcVar1,&local_58);
      std::__cxx11::string::operator=((string *)&g_src_dir_abi_cxx11_,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      this = &local_58;
      goto LAB_0010b33b;
    }
  }
  std::__cxx11::string::string((string *)&local_78,"../test/integration/",(allocator *)&local_58);
  this = &local_78;
  std::__cxx11::string::operator=((string *)&g_src_dir_abi_cxx11_,(string *)this);
LAB_0010b33b:
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void initGlobals(int argc, const char* argv[])
{
  g_bread_path = (argc > 1) ? argv[1] : "./bread" + extension();
  g_inttest_dir = (argc > 2) ? argv[2] + std::string("/") : "./";
  g_src_dir = (argc > 3) ? argv[3] + std::string("/test/integration/") : "../test/integration/";
}